

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O2

void __thiscall
embree::ISPCQuadMesh::ISPCQuadMesh
          (ISPCQuadMesh *this,RTCDevice device,TutorialScene *scene_in,
          Ref<embree::SceneGraph::QuadMeshNode> *in)

{
  pointer pvVar1;
  uint uVar2;
  RTCGeometry pRVar3;
  Vec3fa **ppVVar4;
  long lVar5;
  Vec3fa *pVVar6;
  Vec2<float> *pVVar7;
  Quad *pQVar8;
  size_t i;
  ulong uVar9;
  QuadMeshNode *pQVar10;
  size_t i_1;
  long lVar11;
  Ref<embree::SceneGraph::MaterialNode> local_38;
  
  (this->geom).type = QUAD_MESH;
  (this->geom).geometry = (RTCGeometry)0x0;
  (this->geom).materialID = 0xffffffff;
  (this->geom).visited = false;
  this->positions = (Vec3fa **)0x0;
  this->normals = (Vec3fa **)0x0;
  pRVar3 = (RTCGeometry)rtcNewGeometry(device,1);
  (this->geom).geometry = pRVar3;
  ppVVar4 = (Vec3fa **)
            alignedUSMMalloc((long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(in->ptr->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 2,0x10,
                             DEVICE_READ_ONLY);
  this->positions = ppVVar4;
  lVar11 = 0;
  uVar9 = 0;
  while( true ) {
    pQVar10 = in->ptr;
    pvVar1 = (pQVar10->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(pQVar10->positions).
                  super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
    if ((ulong)(lVar5 >> 5) <= uVar9) break;
    pVVar6 = copyArrayToUSM<embree::Vec3fa>
                       ((avector<embree::Vec3fa> *)(&pvVar1->field_0x0 + lVar11));
    this->positions[uVar9] = pVVar6;
    uVar9 = uVar9 + 1;
    lVar11 = lVar11 + 0x20;
  }
  if ((pQVar10->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (pQVar10->normals).
      super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    ppVVar4 = (Vec3fa **)alignedUSMMalloc(lVar5 >> 2,0x10,DEVICE_READ_ONLY);
    this->normals = ppVVar4;
    lVar11 = 0;
    for (uVar9 = 0; pQVar10 = in->ptr,
        uVar9 < (ulong)((long)(pQVar10->positions).
                              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pQVar10->positions).
                              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5); uVar9 = uVar9 + 1) {
      pVVar6 = copyArrayToUSM<embree::Vec3fa>
                         ((avector<embree::Vec3fa> *)
                          (&((pQVar10->normals).
                             super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->field_0x0 + lVar11));
      this->normals[uVar9] = pVVar6;
      lVar11 = lVar11 + 0x20;
    }
  }
  pVVar7 = copyArrayToUSM<embree::Vec2<float>>(&pQVar10->texcoords);
  this->texcoords = pVVar7;
  pQVar8 = copyArrayToUSM<embree::SceneGraph::QuadMeshNode::Quad>(&in->ptr->quads);
  this->quads = (ISPCQuad *)pQVar8;
  this->startTime = (in->ptr->time_range).lower;
  this->endTime = (in->ptr->time_range).upper;
  this->numTimeSteps =
       (uint)((ulong)((long)(in->ptr->positions).
                            super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(in->ptr->positions).
                           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 5);
  this->numVertices =
       (uint)((in->ptr->positions).
              super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->size_active;
  uVar2 = (*(in->ptr->super_Node).super_RefCount._vptr_RefCount[0xe])();
  this->numQuads = uVar2;
  local_38.ptr = (in->ptr->material).ptr;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  uVar2 = TutorialScene::materialID(scene_in,&local_38);
  (this->geom).materialID = uVar2;
  if (local_38.ptr != (MaterialNode *)0x0) {
    (*((local_38.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  return;
}

Assistant:

ISPCQuadMesh::ISPCQuadMesh (RTCDevice device, TutorialScene* scene_in, Ref<SceneGraph::QuadMeshNode> in) 
    : geom(QUAD_MESH), positions(nullptr), normals(nullptr)
  {
    geom.geometry = rtcNewGeometry (device, RTC_GEOMETRY_TYPE_QUAD);
    
    positions = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
    for (size_t i=0; i<in->numTimeSteps(); i++)
      positions[i] = copyArrayToUSM(in->positions[i]);

    if (in->normals.size()) {
      normals = (Vec3fa**) alignedUSMMalloc(sizeof(Vec3fa*)*in->numTimeSteps());
      for (size_t i=0; i<in->numTimeSteps(); i++)
        normals[i] = copyArrayToUSM(in->normals[i]);
    }
    
    texcoords = copyArrayToUSM(in->texcoords);
    quads = (ISPCQuad*) copyArrayToUSM(in->quads);
    startTime = in->time_range.lower;
    endTime   = in->time_range.upper;
    numTimeSteps = (unsigned) in->numTimeSteps();
    numVertices = (unsigned) in->numVertices();
    numQuads = (unsigned) in->numPrimitives();
    geom.materialID = scene_in->materialID(in->material);
  }